

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

bool __thiscall
Qentem::Value<char>::
CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>,char_const*,unsigned_int)>
          (Value<char> *this,StringStream<char> *stream,RealFormatInfo format,
          _func_void_StringStream<char>_char_ptr_uint *string_function)

{
  int __fd;
  uint uVar1;
  RealFormatInfo format_00;
  StringStream<char> SVar2;
  void *pvStack_30;
  StringStream<char> local_28;
  
LAB_00111d42:
  uVar1 = this->type_ - 1;
  if (9 < uVar1) {
LAB_00111de7:
    return false;
  }
  format_00 = (RealFormatInfo)
              ((long)&switchD_00111d55::switchdataD_0011c15c +
              (long)(int)(&switchD_00111d55::switchdataD_0011c15c)[uVar1]);
  switch((uint)this->type_) {
  case 1:
    goto switchD_00111d55_caseD_1;
  default:
    goto LAB_00111de7;
  case 4:
    if (string_function != (_func_void_StringStream<char>_char_ptr_uint *)0x0) {
      StringStream<char>::StringStream(&local_28,stream);
      SVar2._8_8_ = (this->field_0).array_.storage_;
      SVar2.storage_ = (char *)&local_28;
      (*string_function)(SVar2,(char *)(ulong)(this->field_0).array_.index_,format_00.Precision);
      Memory::Deallocate(local_28.storage_);
      return true;
    }
    __fd = (int)*(undefined8 *)&this->field_0;
    pvStack_30 = (void *)(ulong)(this->field_0).array_.index_;
    goto LAB_00111dda;
  case 5:
    Digit::NumberToString<false,Qentem::StringStream<char>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case 6:
    Digit::NumberToString<false,Qentem::StringStream<char>,long_long>
              (stream,(longlong)(this->field_0).array_.storage_,(RealFormatInfo)0x6);
    return true;
  case 7:
    Digit::realToString<double,Qentem::StringStream<char>,unsigned_long_long>
              ((Digit *)stream,(StringStream<char> *)(this->field_0).array_.storage_,
               (unsigned_long_long)format,format_00);
    return true;
  case 8:
    __fd = 0x11e88d;
    break;
  case 9:
    __fd = 0x11f7f4;
    pvStack_30 = (void *)0x5;
    goto LAB_00111dda;
  case 10:
    __fd = 0x11c72e;
  }
  pvStack_30 = (void *)0x4;
LAB_00111dda:
  StringStream<char>::write(stream,__fd,pvStack_30,(size_t)format_00);
  return true;
switchD_00111d55_caseD_1:
  this = (this->field_0).array_.storage_;
  goto LAB_00111d42;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }